

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O1

void __thiscall
xray_re::se_smart_terrain::state_read(se_smart_terrain *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  uchar value;
  uchar value_2;
  uchar value_3;
  uchar value_4;
  uchar value_5;
  uchar value_6;
  uchar value_7;
  uchar value_8;
  uchar value_9;
  uchar value_10;
  uchar value_11;
  uchar value_12;
  unsigned_short value_1;
  char local_26;
  char local_25;
  char local_24;
  char local_23;
  char local_22;
  char local_21;
  char local_20;
  char local_1f;
  char local_1e;
  char local_1d;
  undefined1 local_1c;
  char local_1b;
  short local_1a;
  
  cse_alife_smart_zone::state_read((cse_alife_smart_zone *)this,packet,size);
  uVar1 = *(ushort *)&this->field_0x28;
  if (uVar1 < 0x80) {
    if (uVar1 < 0x7a) {
      if (uVar1 < 0x75) {
        if (uVar1 == 0x65) {
          xr_packet::r_raw(packet,&local_1c,1);
          r_ctime(packet);
          r_ctime(packet);
          xr_packet::r_raw(packet,&local_1b,1);
          if (local_1b == '\0') {
            return;
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                        ,0x205,
                        "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)")
          ;
        }
        if (uVar1 == 0x68) {
          return;
        }
      }
      else {
        if (uVar1 == 0x75) {
          return;
        }
        if (uVar1 == 0x76) {
          r_ctime(packet);
          r_ctime(packet);
          xr_packet::r_raw(packet,&local_1d,1);
          if (local_1d == '\0') {
            return;
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                        ,0x1fb,
                        "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)")
          ;
        }
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x207,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    if (0x7c < uVar1) {
      __assert_fail("m_version <= CSE_VERSION_CS",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1d0,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_smart_terrain");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"CCombat_manager");
    xr_packet::r_raw(packet,&local_26,1);
    if (local_26 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1d7,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"nil");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1d9,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1a,2);
    if (local_1a != -1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1db,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    pcVar3 = xr_packet::skip_sz(packet);
    iVar2 = strcmp(pcVar3,"nil");
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1dd,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_25,1);
    if (local_25 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1df,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_24,1);
    if (local_24 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1e1,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_23,1);
    if (local_23 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1e3,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_22,1);
    if (local_22 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1e5,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"CCover_manager");
    xr_packet::r_raw(packet,&local_21,1);
    if (local_21 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1ea,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_20,1);
    if (local_20 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1ec,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"CCover_manager");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"CCombat_manager");
    xr_packet::r_raw(packet,&local_1f,1);
    if (local_1f != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1f2,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_raw(packet,&local_1e,1);
    if (local_1e != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,500,"virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)"
                   );
    }
  }
  else {
    if (uVar1 != 0x80) {
      __assert_fail("m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x1be,
                    "virtual void xray_re::se_smart_terrain::state_read(xr_packet &, uint16_t)");
    }
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_smart_terrain");
    xr_packet::r_raw(packet,&this->arriving_npc_count,1);
    xr_packet::r_raw(packet,&this->npc_info_count,1);
    xr_packet::r_raw(packet,&this->dead_time_count,1);
    xr_packet::r_raw(packet,&this->base_on_actor_control_present,1);
    if (this->base_on_actor_control_present == '\x01') {
      return;
    }
    xr_packet::r_raw(packet,&this->is_respawn_point,1);
    if (this->is_respawn_point == '\x01') {
      return;
    }
    xr_packet::r_raw(packet,&this->population,1);
  }
  cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"se_smart_terrain");
  return;
}

Assistant:

void se_smart_terrain::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_smart_zone::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);

		set_save_marker(packet, SM_LOAD, false, "se_smart_terrain");

    	packet.r_u8(arriving_npc_count);
    	packet.r_u8(npc_info_count);
    	packet.r_u8(dead_time_count);
    	packet.r_u8(base_on_actor_control_present);
		if (base_on_actor_control_present == 1)
			return;
    	packet.r_u8(is_respawn_point);
		if (is_respawn_point == 1)
			return;
    	packet.r_u8(population);
	  
	  	set_save_marker(packet, SM_LOAD, true, "se_smart_terrain");
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);

		set_save_marker(packet, SM_LOAD, false, "se_smart_terrain");

		// CCombat_manager
		set_save_marker(packet, SM_LOAD, false, "CCombat_manager");
		if (packet.r_bool())			// actor_defense_come
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// combat_quest
			xr_not_implemented();
		if (packet.r_u16() != 0xffff)		// task
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// see_actor_enemy
			xr_not_implemented();
		if (packet.r_bool())			// see_actor_enemy_time presence
			xr_not_implemented();
		if (packet.r_u8())			// #squads
			xr_not_implemented();
		if (packet.r_bool())			// force_online
			xr_not_implemented();
		if (packet.r_u8())			// #force_online_squads
			xr_not_implemented();

		// CCover_manager
		set_save_marker(packet, SM_LOAD, false, "CCover_manager");
		if (packet.r_bool())			// is_valid
			xr_not_implemented();
		if (packet.r_u8())			// #cover_table
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CCover_manager");
		set_save_marker(packet, SM_LOAD, true, "CCombat_manager");

		// actual se_smart_terrain
		if (packet.r_u8())		// #npc_info
			xr_not_implemented();
		if (packet.r_u8())		// #dead_time
			xr_not_implemented();

		set_save_marker(packet, SM_LOAD, true, "se_smart_terrain");
	} else if (m_version == CSE_VERSION_SOC) {
		r_ctime(packet);		// duration_end
		r_ctime(packet);		// idle_end
		if (packet.r_bool())		// gulag_working
			xr_not_implemented();
	} else if (m_version == CSE_VERSION_2232) {
		//script save nothing
	} else if (m_version == CSE_VERSION_2571) {
		//script save nothing
	} else if (m_version == CSE_VERSION_2215) {
		packet.r_u8();			// gulagN
		r_ctime(packet);		// duration_end
		r_ctime(packet);		// idle_end
		if (packet.r_u8())		// #npcs
			xr_not_implemented();
	} else {
		xr_not_implemented();
	}
}